

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

bool __thiscall
google::protobuf::TextFormat::Printer::PrintAny
          (Printer *this,Message *message,BaseTextGenerator *generator)

{
  string *__return_storage_ptr__;
  FieldDescriptor *this_00;
  bool bVar1;
  int iVar2;
  Reflection *this_01;
  undefined4 extraout_var;
  LogMessage *pLVar3;
  Message *pMVar4;
  MessageLite *this_02;
  FastFieldValuePrinter *pFVar5;
  type message_00;
  string *in_R8;
  string_view sVar6;
  Descriptor *local_1d8;
  FastFieldValuePrinter *printer;
  LogMessage local_180 [23];
  Voidify local_169;
  string_view local_168;
  undefined1 local_158 [8];
  string serialized_value;
  unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
  value_message;
  DynamicMessageFactory factory;
  LogMessage local_e8 [23];
  Voidify local_d1;
  Descriptor *local_d0;
  Descriptor *value_descriptor;
  undefined1 local_b8 [16];
  undefined1 local_a8 [8];
  string full_type_name;
  string url_prefix;
  string *type_url;
  Reflection *reflection;
  FieldDescriptor *value_field;
  FieldDescriptor *type_url_field;
  BaseTextGenerator *generator_local;
  Message *message_local;
  Printer *this_local;
  
  type_url_field = (FieldDescriptor *)generator;
  generator_local = (BaseTextGenerator *)message;
  message_local = (Message *)this;
  bVar1 = internal::GetAnyFieldDescriptors(message,&value_field,(FieldDescriptor **)&reflection);
  if (bVar1) {
    this_01 = Message::GetReflection((Message *)generator_local);
    __return_storage_ptr__ = (string *)(url_prefix.field_2._M_local_buf + 8);
    Reflection::GetString_abi_cxx11_
              (__return_storage_ptr__,this_01,(Message *)generator_local,value_field);
    std::__cxx11::string::string((string *)(full_type_name.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)local_a8);
    local_b8 = std::__cxx11::string::operator_cast_to_basic_string_view
                         ((string *)__return_storage_ptr__);
    sVar6._M_str = full_type_name.field_2._M_local_buf + 8;
    sVar6._M_len = local_b8._8_8_;
    bVar1 = internal::ParseAnyTypeUrl(local_b8._0_8_,sVar6,(string *)local_a8,in_R8);
    if (bVar1) {
      if (this->finder_ == (Finder *)0x0) {
        local_1d8 = anon_unknown_1::DefaultFinderFindAnyType
                              ((Message *)generator_local,
                               (string *)((long)&full_type_name.field_2 + 8),(string *)local_a8);
      }
      else {
        iVar2 = (*this->finder_->_vptr_Finder[4])
                          (this->finder_,generator_local,
                           (undefined1 *)((long)&full_type_name.field_2 + 8),local_a8);
        local_1d8 = (Descriptor *)CONCAT44(extraout_var,iVar2);
      }
      local_d0 = local_1d8;
      if (local_1d8 == (Descriptor *)0x0) {
        absl::lts_20240722::log_internal::LogMessage::LogMessage
                  (local_e8,
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/text_format.cc"
                   ,0x93c);
        pLVar3 = absl::lts_20240722::log_internal::LogMessage::InternalStream(local_e8);
        pLVar3 = absl::lts_20240722::log_internal::LogMessage::operator<<
                           (pLVar3,(char (*) [39])"Can\'t print proto content: proto type ");
        pLVar3 = (LogMessage *)
                 absl::lts_20240722::log_internal::LogMessage::operator<<
                           (pLVar3,(string *)__return_storage_ptr__);
        pLVar3 = absl::lts_20240722::log_internal::LogMessage::operator<<
                           (pLVar3,(char (*) [11])" not found");
        absl::lts_20240722::log_internal::Voidify::operator&&(&local_d1,pLVar3);
        absl::lts_20240722::log_internal::LogMessage::~LogMessage(local_e8);
        this_local._7_1_ = 0;
        value_descriptor._0_4_ = 1;
      }
      else {
        DynamicMessageFactory::DynamicMessageFactory((DynamicMessageFactory *)&value_message);
        pMVar4 = DynamicMessageFactory::GetPrototype
                           ((DynamicMessageFactory *)&value_message,local_d0);
        pMVar4 = Message::New(pMVar4);
        std::unique_ptr<google::protobuf::Message,std::default_delete<google::protobuf::Message>>::
        unique_ptr<std::default_delete<google::protobuf::Message>,void>
                  ((unique_ptr<google::protobuf::Message,std::default_delete<google::protobuf::Message>>
                    *)(serialized_value.field_2._M_local_buf + 8),pMVar4);
        Reflection::GetString_abi_cxx11_
                  ((string *)local_158,this_01,(Message *)generator_local,
                   (FieldDescriptor *)reflection);
        this_02 = &std::
                   unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
                   ::operator->((unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
                                 *)((long)&serialized_value.field_2 + 8))->super_MessageLite;
        local_168 = (string_view)
                    std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_158);
        bVar1 = MessageLite::ParseFromString(this_02,local_168);
        if (bVar1) {
          BaseTextGenerator::PrintLiteral<2ul>
                    ((BaseTextGenerator *)type_url_field,(char (*) [2])0x603b69);
          this_00 = type_url_field;
          sVar6 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view
                            ((string *)__return_storage_ptr__);
          BaseTextGenerator::PrintString((BaseTextGenerator *)this_00,sVar6);
          BaseTextGenerator::PrintLiteral<2ul>
                    ((BaseTextGenerator *)type_url_field,(char (*) [2])0x725bc4);
          pFVar5 = GetFieldPrinter(this,(FieldDescriptor *)reflection);
          (*pFVar5->_vptr_FastFieldValuePrinter[0xe])
                    (pFVar5,generator_local,0xffffffff,0,(ulong)(this->single_line_mode_ & 1),
                     type_url_field);
          (**(code **)(*(long *)type_url_field + 0x10))();
          message_00 = std::
                       unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
                       ::operator*((unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
                                    *)((long)&serialized_value.field_2 + 8));
          Print(this,message_00,(BaseTextGenerator *)type_url_field);
          (**(code **)(*(long *)type_url_field + 0x18))();
          (*pFVar5->_vptr_FastFieldValuePrinter[0x10])
                    (pFVar5,generator_local,0xffffffff,0,(ulong)(this->single_line_mode_ & 1),
                     type_url_field);
        }
        else {
          absl::lts_20240722::log_internal::LogMessage::LogMessage
                    (local_180,
                     "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/text_format.cc"
                     ,0x945);
          pLVar3 = absl::lts_20240722::log_internal::LogMessage::InternalStream(local_180);
          pLVar3 = (LogMessage *)
                   absl::lts_20240722::log_internal::LogMessage::operator<<
                             (pLVar3,(string *)__return_storage_ptr__);
          pLVar3 = absl::lts_20240722::log_internal::LogMessage::operator<<
                             (pLVar3,(char (*) [27])": failed to parse contents");
          absl::lts_20240722::log_internal::Voidify::operator&&(&local_169,pLVar3);
          absl::lts_20240722::log_internal::LogMessage::~LogMessage(local_180);
        }
        value_descriptor._0_4_ = 1;
        this_local._7_1_ = bVar1;
        std::__cxx11::string::~string((string *)local_158);
        std::unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
        ::~unique_ptr((unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
                       *)((long)&serialized_value.field_2 + 8));
        DynamicMessageFactory::~DynamicMessageFactory((DynamicMessageFactory *)&value_message);
      }
    }
    else {
      this_local._7_1_ = 0;
      value_descriptor._0_4_ = 1;
    }
    std::__cxx11::string::~string((string *)local_a8);
    std::__cxx11::string::~string((string *)(full_type_name.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(url_prefix.field_2._M_local_buf + 8));
  }
  else {
    this_local._7_1_ = 0;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool TextFormat::Printer::PrintAny(const Message& message,
                                   BaseTextGenerator* generator) const {
  const FieldDescriptor* type_url_field;
  const FieldDescriptor* value_field;
  if (!internal::GetAnyFieldDescriptors(message, &type_url_field,
                                        &value_field)) {
    return false;
  }

  const Reflection* reflection = message.GetReflection();

  // Extract the full type name from the type_url field.
  const std::string& type_url = reflection->GetString(message, type_url_field);
  std::string url_prefix;
  std::string full_type_name;

  if (!internal::ParseAnyTypeUrl(type_url, &url_prefix, &full_type_name)) {
    return false;
  }

  // Print the "value" in text.
  const Descriptor* value_descriptor =
      finder_ ? finder_->FindAnyType(message, url_prefix, full_type_name)
              : DefaultFinderFindAnyType(message, url_prefix, full_type_name);
  if (value_descriptor == nullptr) {
    ABSL_LOG(WARNING) << "Can't print proto content: proto type " << type_url
                      << " not found";
    return false;
  }
  DynamicMessageFactory factory;
  std::unique_ptr<Message> value_message(
      factory.GetPrototype(value_descriptor)->New());
  std::string serialized_value = reflection->GetString(message, value_field);
  if (!value_message->ParseFromString(serialized_value)) {
    ABSL_LOG(WARNING) << type_url << ": failed to parse contents";
    return false;
  }
  generator->PrintLiteral("[");
  generator->PrintString(type_url);
  generator->PrintLiteral("]");
  const FastFieldValuePrinter* printer = GetFieldPrinter(value_field);
  printer->PrintMessageStart(message, -1, 0, single_line_mode_, generator);
  generator->Indent();
  Print(*value_message, generator);
  generator->Outdent();
  printer->PrintMessageEnd(message, -1, 0, single_line_mode_, generator);
  return true;
}